

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::PipelineHook,_std::nullptr_t> capnp::getDisabledPipeline(void)

{
  Disposer *in_RDI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar1;
  
  OVar1 = getDisabledPipeline::DisabledPipelineHook::addRef((DisabledPipelineHook *)in_RDI);
  OVar1.disposer = in_RDI;
  return OVar1;
}

Assistant:

kj::Own<PipelineHook> getDisabledPipeline() {
  class DisabledPipelineHook final: public PipelineHook {
  public:
    kj::Own<PipelineHook> addRef() override {
      return kj::Own<PipelineHook>(this, kj::NullDisposer::instance);
    }

    kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
      return newBrokenCap(KJ_EXCEPTION(FAILED,
          "caller specified noPromisePipelining hint, but then tried to pipeline"));
    }

    kj::Own<ClientHook> getPipelinedCap(kj::Array<PipelineOp>&& ops) override {
      return newBrokenCap(KJ_EXCEPTION(FAILED,
          "caller specified noPromisePipelining hint, but then tried to pipeline"));
    }
  };
  static DisabledPipelineHook instance;
  return instance.addRef();
}